

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::trycatch<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this;
  size_t sVar1;
  bool bVar2;
  undefined3 in_register_00000009;
  string *psVar3;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  undefined1 local_230 [8];
  Result<wasm::Ok> type;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  optional<wasm::Name> label;
  string local_a8 [32];
  undefined1 local_88 [8];
  Result<wasm::Ok> _val_3;
  Result<wasm::Ok> _val;
  
  if (CONCAT31(in_register_00000009,folded) == 0) {
    expected_00._M_str = "try";
    expected_00._M_len = 3;
    bVar2 = Lexer::takeKeyword(&ctx->in,expected_00);
  }
  else {
    expected._M_str = "try";
    expected._M_len = 3;
    bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
  }
  if (bVar2 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_c8,&ctx->in);
  blocktype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_230,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_230);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)local_88,
               (string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_88);
    psVar3 = (string *)local_88;
    goto LAB_00c16fd5;
  }
  this = (_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage(this);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  if ((folded) &&
     (expected_01._M_str = "do", expected_01._M_len = 2,
     bVar2 = Lexer::takeSExprStart(&ctx->in,expected_01), !bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),"expected \'do\' in try",
               (allocator<char> *)local_88);
    Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in,
               (string *)
               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    psVar3 = (string *)
             ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
LAB_00c1725f:
    std::__cxx11::string::~string((string *)psVar3);
    goto LAB_00c16fe3;
  }
  instrs<wasm::WATParser::ParseDeclsCtx>
            ((Result<wasm::Ok> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  if (folded) {
    bVar2 = Lexer::takeRParen(&ctx->in);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"expected \')\' at end of do",(allocator<char> *)local_88);
      Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in,
                 &local_1e8);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      psVar3 = &local_1e8;
      goto LAB_00c1725f;
    }
    expected_02._M_str = "delegate";
    expected_02._M_len = 8;
    bVar2 = Lexer::takeSExprStart(&ctx->in,expected_02);
  }
  else {
    expected_03._M_str = "delegate";
    expected_03._M_len = 8;
    bVar2 = Lexer::takeKeyword(&ctx->in,expected_03);
  }
  if (bVar2 == false) {
    label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_8_ = __return_storage_ptr__;
    do {
      if (folded) {
        expected_04._M_str = "catch";
        expected_04._M_len = 5;
        bVar2 = Lexer::takeSExprStart(&ctx->in,expected_04);
        if (!bVar2) {
          expected_07._M_str = "catch_all";
          expected_07._M_len = 9;
          bVar2 = Lexer::takeSExprStart(&ctx->in,expected_07);
          __return_storage_ptr__ =
               (MaybeResult<wasm::Ok> *)
               label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          if (bVar2) {
LAB_00c173c4:
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            instrs<wasm::WATParser::ParseDeclsCtx>
                      ((Result<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            if (!folded) goto LAB_00c17568;
            bVar2 = Lexer::takeRParen(&ctx->in);
            if (!bVar2) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"expected \')\' at end of catch_all",
                         (allocator<char> *)local_88);
              Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in
                         ,&local_148);
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         __return_storage_ptr__,
                         (__index_type *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              psVar3 = &local_148;
              goto LAB_00c1725f;
            }
          }
          bVar2 = Lexer::takeRParen(&ctx->in);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_128,"expected \')\' at end of try",
                       (allocator<char> *)local_88);
            Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in,
                       &local_128);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            psVar3 = &local_128;
            goto LAB_00c1725f;
          }
LAB_00c175f8:
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>
                    (__return_storage_ptr__,
                     (Result<wasm::Ok> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          goto LAB_00c16fda;
        }
      }
      else {
        expected_05._M_str = "catch";
        expected_05._M_len = 5;
        bVar2 = Lexer::takeKeyword(&ctx->in,expected_05);
        if (!bVar2) {
          expected_06._M_str = "catch_all";
          expected_06._M_len = 9;
          bVar2 = Lexer::takeKeyword(&ctx->in,expected_06);
          __return_storage_ptr__ =
               (MaybeResult<wasm::Ok> *)
               label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          if (bVar2) {
            Lexer::takeID((optional<wasm::Name> *)local_88,&ctx->in);
            if ((_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ != '\x01') ||
               ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
                (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ ==
                 label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_len)))) goto LAB_00c173c4;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_168,"catch_all label does not match try label",
                       (allocator<char> *)local_a8);
            Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in,
                       &local_168);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            psVar3 = &local_168;
          }
          else {
LAB_00c17568:
            expected_08._M_str = "end";
            expected_08._M_len = 3;
            bVar2 = Lexer::takeKeyword(&ctx->in,expected_08);
            if (bVar2) {
              Lexer::takeID((optional<wasm::Name> *)local_88,&ctx->in);
              if ((_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ != '\x01') ||
                 ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
                  (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ ==
                   label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len)))) goto LAB_00c175f8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"end label does not match try label",
                         (allocator<char> *)local_a8);
              Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in
                         ,&local_e8);
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         __return_storage_ptr__,
                         (__index_type *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              psVar3 = &local_e8;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"expected \'end\' at end of try",
                         (allocator<char> *)local_88);
              Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in
                         ,&local_108);
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         __return_storage_ptr__,
                         (__index_type *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              psVar3 = &local_108;
            }
          }
          goto LAB_00c1725f;
        }
      }
      sVar1 = (ctx->in).pos;
      bVar2 = !folded;
      while (((((~bVar2 | folded) & 1U) == 0 &&
              (Lexer::takeID((optional<wasm::Name> *)this,&ctx->in),
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ == '\x01')) &&
             ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01' ||
              (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ !=
               label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
              ))))) {
        (ctx->in).pos = sVar1;
        Lexer::advance(&ctx->in);
        bVar2 = false;
      }
      tagidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)this,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88,
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)this);
      __return_storage_ptr__ =
           (MaybeResult<wasm::Ok> *)
           label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
      if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string(local_a8,(string *)local_88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_a8);
        goto LAB_00c172ee;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
      _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ = 0;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
      instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_88,ctx);
      if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string(local_a8,(string *)local_88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_a8);
        goto LAB_00c172ee;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
      if ((folded) && (bVar2 = Lexer::takeRParen(&ctx->in), !bVar2)) goto LAB_00c17405;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                (this);
    } while( true );
  }
  labelidx<wasm::WATParser::ParseDeclsCtx>
            ((Result<wasm::Ok> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx,true);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88,
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string(local_a8,(string *)local_88);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_a8);
LAB_00c172ee:
    std::__cxx11::string::~string(local_a8);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
    if (folded) {
      bVar2 = Lexer::takeRParen(&ctx->in);
      if (bVar2) {
        bVar2 = Lexer::takeRParen(&ctx->in);
        if (bVar2) goto LAB_00c17297;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"expected \')\' at end of try",(allocator<char> *)local_a8);
        Lexer::err((Err *)local_88,&ctx->in,&local_1a8);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_88);
        std::__cxx11::string::~string((string *)local_88);
        psVar3 = &local_1a8;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"expected \')\' at end of delegate",
                   (allocator<char> *)local_a8);
        Lexer::err((Err *)local_88,&ctx->in,&local_1c8);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_88);
        std::__cxx11::string::~string((string *)local_88);
        psVar3 = &local_1c8;
      }
      goto LAB_00c16fd5;
    }
LAB_00c17297:
    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ = 0;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
  }
LAB_00c16fda:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
LAB_00c16fe3:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
  return (MaybeResult<wasm::Ok> *)
         (_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__;
LAB_00c17405:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"expected \')\' at end of catch",(allocator<char> *)local_a8);
  Lexer::err((Err *)local_88,&ctx->in,&local_188);
  std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
  _Variant_storage<2ul,wasm::Err>
            ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
             local_88);
  std::__cxx11::string::~string((string *)local_88);
  psVar3 = &local_188;
LAB_00c16fd5:
  std::__cxx11::string::~string((string *)psVar3);
  goto LAB_00c16fda;
}

Assistant:

MaybeResult<>
trycatch(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("try"sv)) ||
      (!folded && !ctx.in.takeKeyword("try"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  CHECK_ERR(ctx.makeTry(pos, annotations, label, *type));

  if (folded) {
    if (!ctx.in.takeSExprStart("do"sv)) {
      return ctx.in.err("expected 'do' in try");
    }
  }

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of do");
    }
  }

  if ((folded && ctx.in.takeSExprStart("delegate")) ||
      (!folded && ctx.in.takeKeyword("delegate"))) {
    auto delegatePos = ctx.in.getPos();

    auto label = labelidx(ctx, true);
    CHECK_ERR(label);

    if (folded) {
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected ')' at end of delegate");
      }
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected ')' at end of try");
      }
    }

    CHECK_ERR(ctx.visitDelegate(delegatePos, *label));
    return Ok{};
  }

  while (true) {
    auto catchPos = ctx.in.getPos();

    if ((folded && !ctx.in.takeSExprStart("catch"sv)) ||
        (!folded && !ctx.in.takeKeyword("catch"sv))) {
      break;
    }

    // It can be ambiguous whether the name after `catch` is intended to be the
    // optional ID or the tag identifier. For example:
    //
    // (tag $t)
    // (func $ambiguous
    //   try $t
    //   catch $t
    //   end
    // )
    //
    // When parsing the `catch`, the parser first tries to parse an optional ID
    // that must match the label of the `try`, and it succeeds because it sees
    // `$t` after the catch. However, when it then tries to parse the mandatory
    // tag index, it fails because the next token is `end`. The problem is that
    // the `$t` after the `catch` was the tag name and there was no optional ID
    // after all. The parser sets `parseID = false` and resets to just after the
    // `catch`, and now it skips parsing the optional ID so it correctly parses
    // the `$t` as a tag name.
    bool parseID = !folded;
    auto afterCatchPos = ctx.in.getPos();
    while (true) {
      if (!folded && parseID) {
        auto id = ctx.in.takeID();
        if (id && id != label) {
          // Instead of returning an error, retry without the ID.
          parseID = false;
          ctx.in.setPos(afterCatchPos);
          continue;
        }
      }

      auto tag = tagidx(ctx);
      if (parseID && tag.getErr()) {
        // Instead of returning an error, retry without the ID.
        parseID = false;
        ctx.in.setPos(afterCatchPos);
        continue;
      }
      CHECK_ERR(tag);

      CHECK_ERR(ctx.visitCatch(catchPos, *tag));

      CHECK_ERR(instrs(ctx));

      if (folded) {
        if (!ctx.in.takeRParen()) {
          return ctx.in.err("expected ')' at end of catch");
        }
      }
      break;
    }
  }

  if ((folded && ctx.in.takeSExprStart("catch_all"sv)) ||
      (!folded && ctx.in.takeKeyword("catch_all"sv))) {
    auto catchPos = ctx.in.getPos();

    if (!folded) {
      auto id = ctx.in.takeID();
      if (id && id != label) {
        return ctx.in.err("catch_all label does not match try label");
      }
    }

    CHECK_ERR(ctx.visitCatchAll(catchPos));

    CHECK_ERR(instrs(ctx));

    if (folded) {
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected ')' at end of catch_all");
      }
    }
  }

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of try");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of try");
    }

    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match try label");
    }
  }
  return ctx.visitEnd();
}